

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.h
# Opt level: O2

void __thiscall MinVR::VRDatumIntArray::VRDatumIntArray(VRDatumIntArray *this,VRIntArray *inVal)

{
  _Vector_base<int,_std::allocator<int>_> _Stack_28;
  
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&_Stack_28,inVal);
  VRDatumSpecialized<std::vector<int,_std::allocator<int>_>,_(MinVR::VRCORETYPE_ID)4>::
  VRDatumSpecialized((VRDatumSpecialized<std::vector<int,_std::allocator<int>_>,_(MinVR::VRCORETYPE_ID)4>
                      *)this,(vector<int,_std::allocator<int>_> *)&_Stack_28);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&_Stack_28);
  (this->super_VRDatumSpecialized<std::vector<int,_std::allocator<int>_>,_(MinVR::VRCORETYPE_ID)4>).
  super_VRDatum_conflict._vptr_VRDatum = (_func_int **)&PTR__VRDatumSpecialized_0013ca98;
  return;
}

Assistant:

VRDatumIntArray(const VRIntArray inVal) :
    VRDatumSpecialized<VRIntArray, VRCORETYPE_INTARRAY>(inVal) {}